

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_spec.c
# Opt level: O0

void test_delimiters_5(void)

{
  char *in_stack_00000590;
  char *in_stack_00000598;
  char *in_stack_000005a0;
  char *in_stack_000005a8;
  char *in_stack_000005b0;
  
  run(in_stack_000005b0,in_stack_000005a8,in_stack_000005a0,in_stack_00000598,in_stack_00000590);
  return;
}

Assistant:

static void
test_delimiters_5(void)
{
    run(
        "delimiters set in a parent template should not affect a partial",
        "[ {{>include}} ]\n{{= | | =}}\n[ |>include| ]\n",
        "{\"value\": \"yes\"}",
        "{\"include\": \".{{value}}.\"}",
        "[ .yes. ]\n[ .yes. ]\n"
    );
}